

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

SUNErrCode N_VBufSize_ManyVector(N_Vector x,sunindextype *size)

{
  long *in_RSI;
  long *in_RDI;
  sunindextype i;
  sunindextype subvec_size;
  SUNContext_conflict sunctx_local_scope_;
  long local_28;
  long local_20;
  long local_18;
  long *local_10;
  long *local_8;
  
  local_18 = in_RDI[2];
  *in_RSI = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_28 = 0; local_28 < *(long *)*local_8; local_28 = local_28 + 1) {
    N_VBufSize(*(undefined8 *)(*(long *)(*local_8 + 0x10) + local_28 * 8),&local_20);
    *local_10 = local_20 + *local_10;
  }
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VBufSize)(N_Vector x, sunindextype* size)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype subvec_size; /* subvector buffer size */
  sunindextype i;

  /* initialize total size */
  *size = 0;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* get buffer sized needed for this subvector */
    SUNCheckCall(N_VBufSize(MANYVECTOR_SUBVEC(x, i), &subvec_size));

    /* update total buffer size */
    *size += subvec_size;
  }

  return SUN_SUCCESS;
}